

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::move(CImgDisplay *this,int posx,int posy)

{
  Display *pDVar1;
  bool bVar2;
  X11_static *pXVar3;
  Display *dpy;
  int posy_local;
  int posx_local;
  CImgDisplay *this_local;
  
  bVar2 = is_empty(this);
  this_local = this;
  if (!bVar2) {
    show(this);
    if ((this->_window_x != posx) || (this->_window_y != posy)) {
      pXVar3 = cimg::X11_attr();
      pDVar1 = pXVar3->display;
      cimg::mutex(0xf,1);
      XMoveWindow(pDVar1,this->_window,posx,posy);
      this->_window_x = posx;
      this->_window_y = posy;
      cimg::mutex(0xf,0);
    }
    this->_is_moved = false;
    this_local = paint(this,true);
  }
  return this_local;
}

Assistant:

CImgDisplay& move(const int posx, const int posy) {
      if (is_empty()) return *this;
      show();
      if (_window_x!=posx || _window_y!=posy) {
        Display *const dpy = cimg::X11_attr().display;
        cimg_lock_display();
        XMoveWindow(dpy,_window,posx,posy);
        _window_x = posx;
        _window_y = posy;
        cimg_unlock_display();
      }
      _is_moved = false;
      return paint();
    }